

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::RecordTargetProgress
          (cmGlobalUnixMakefileGenerator3 *this,cmMakefileTargetGenerator *tg)

{
  int iVar1;
  mapped_type *pmVar2;
  undefined4 extraout_var;
  cmGeneratorTarget *local_38 [4];
  
  local_38[0] = (tg->super_cmCommonTargetGenerator).GeneratorTarget;
  pmVar2 = std::
           map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
           ::operator[](&this->ProgressMap,local_38);
  iVar1 = (*(tg->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[5])(tg);
  pmVar2->NumberOfActions = CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::string((string *)local_38,(string *)&tg->ProgressFileNameFull);
  std::__cxx11::string::operator=((string *)&pmVar2->VariableFile,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
cmGlobalUnixMakefileGenerator3::RecordTargetProgress(
  cmMakefileTargetGenerator* tg)
{
  TargetProgress& tp = this->ProgressMap[tg->GetGeneratorTarget()];
  tp.NumberOfActions = tg->GetNumberOfProgressActions();
  tp.VariableFile = tg->GetProgressFileNameFull();
}